

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue)

{
  fio_defer_queue_block_s *pfVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  fio_defer_queue_block_s *pfVar5;
  size_t sVar6;
  fio_defer_queue_block_s *pfVar7;
  _func_void_void_ptr_void_ptr *p_Var8;
  void *pvVar9;
  void *pvVar10;
  fio_lock_i ret;
  
  fio_lock(&queue->lock);
  pfVar1 = queue->reader;
  sVar2 = pfVar1->read;
  if ((pfVar1->write == sVar2) && (pfVar1->state == '\0')) {
    p_Var8 = (_func_void_void_ptr_void_ptr *)0x0;
    pvVar10 = (void *)0x0;
    pvVar9 = (void *)0x0;
  }
  else {
    sVar6 = sVar2 + 1;
    pfVar1->read = sVar6;
    p_Var8 = pfVar1->tasks[sVar2].func;
    pvVar9 = pfVar1->tasks[sVar2].arg2;
    if (sVar6 == 0xa8) {
      pfVar1->read = 0;
      pfVar1->state = '\0';
      sVar6 = 0;
    }
    pvVar10 = pfVar1->tasks[sVar2].arg1;
    if (pfVar1->write == sVar6) {
      pfVar7 = pfVar1;
      if (pfVar1->next == (fio_defer_queue_block_s *)0x0) {
        pfVar5 = &queue->static_queue;
        if ((pfVar1 == pfVar5) || ((queue->static_queue).state != '\x02')) {
          pfVar7 = (fio_defer_queue_block_s *)0x0;
          pfVar5 = pfVar1;
        }
        else {
          queue->writer = pfVar5;
          queue->reader = pfVar5;
        }
        pfVar5->write = 0;
        pfVar5->read = 0;
        pfVar5->state = '\0';
      }
      else {
        queue->reader = pfVar1->next;
      }
      if (pfVar7 == &queue->static_queue) {
        (queue->static_queue).state = '\x02';
        (queue->static_queue).next = (fio_defer_queue_block_s *)0x0;
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      goto LAB_00105c7a;
    }
  }
  bVar3 = false;
  pfVar7 = (fio_defer_queue_block_s *)0x0;
LAB_00105c7a:
  LOCK();
  queue->lock = '\0';
  UNLOCK();
  if (pfVar7 != (fio_defer_queue_block_s *)0x0 && !bVar3) {
    fio_free(pfVar7);
  }
  if (p_Var8 == (_func_void_void_ptr_void_ptr *)0x0) {
    iVar4 = -1;
  }
  else {
    (*p_Var8)(pvVar10,pvVar9);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static inline int
fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue) {
  fio_defer_task_s task = fio_defer_pop_task(queue);
  if (!task.func)
    return -1;
  task.func(task.arg1, task.arg2);
  return 0;
}